

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_annotationbase.cpp
# Opt level: O2

void __thiscall
ON_Annotation::SetSuppressExtension2(ON_Annotation *this,ON_DimStyle *parent_style,bool suppress)

{
  bool bVar1;
  ON_DimStyle *pOVar2;
  
  pOVar2 = ON_DimStyle::DimStyleOrDefault(parent_style);
  bVar1 = ON_DimStyle::SuppressExtension2(pOVar2);
  pOVar2 = Internal_GetOverrideStyle(this,bVar1 != suppress);
  if (pOVar2 != (ON_DimStyle *)0x0) {
    ON_DimStyle::SetSuppressExtension2(pOVar2,suppress);
    ON_DimStyle::SetFieldOverride(pOVar2,SuppressExtension2,bVar1 != suppress);
    return;
  }
  return;
}

Assistant:

void ON_Annotation::SetSuppressExtension2(const ON_DimStyle* parent_style, bool suppress)
{
  parent_style = &ON_DimStyle::DimStyleOrDefault(parent_style);
  bool bCreate = (suppress != parent_style->SuppressExtension2());
  ON_DimStyle* override_style = Internal_GetOverrideStyle(bCreate);
  if (nullptr != override_style)
  {
    override_style->SetSuppressExtension2(suppress);
    override_style->SetFieldOverride(ON_DimStyle::field::SuppressExtension2, bCreate);
  }
}